

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_acos>(Mat *a,Option *opt)

{
  long *in_RDI;
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  __m128 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_acos op;
  Mat *m;
  __m128 big_final_approx;
  __m128 small_final_approx;
  __m128 x1;
  __m128 output_approx;
  __m128 fourth_power_of_input_approx;
  __m128 square_of_input_approx;
  __m128 input_approx;
  __m128 big_input_approx;
  __m128 is_small_input;
  __m128 absolute;
  __m128 negative_mask;
  __m128 magic_pi;
  __m128 magic_half_pi;
  __m128 magic_a1;
  __m128 magic_a0;
  __m128 magic_a3;
  __m128 magic_a2;
  __m128 magic_a5;
  __m128 magic_a4;
  __m128 magic_one;
  __m128 magic_half_one;
  __m128 magic_zero;
  __m128 magic_negative_zero;
  ulong local_988;
  ulong uStack_980;
  int local_974;
  undefined8 local_970;
  undefined8 local_968;
  undefined8 local_960;
  undefined4 local_958;
  long local_950;
  undefined4 local_948;
  undefined4 local_944;
  undefined4 local_940;
  undefined4 local_93c;
  undefined4 local_938;
  undefined8 local_930;
  float *local_928;
  int local_920;
  int local_91c;
  int local_918;
  int local_914;
  int local_910;
  int local_90c;
  int local_908;
  undefined1 local_901 [9];
  long *local_8f8;
  undefined1 local_8ed;
  int local_8ec;
  undefined8 *local_8e0;
  undefined8 *local_8d8;
  undefined8 *local_8c8;
  float *local_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  float *local_8a8;
  long local_8a0;
  undefined4 local_894;
  long local_890;
  float *local_888;
  undefined4 local_87c;
  int local_878;
  int local_874;
  undefined8 *local_870;
  undefined4 local_864;
  long local_860;
  undefined8 *local_850;
  ulong *local_828;
  undefined1 *local_820;
  float *local_818;
  undefined1 *local_810;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  float local_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float local_7c8;
  float fStack_7c4;
  float fStack_7c0;
  float fStack_7bc;
  float local_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float local_7a8;
  float fStack_7a4;
  float fStack_7a0;
  float fStack_79c;
  float local_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float local_788;
  float fStack_784;
  float fStack_780;
  float fStack_77c;
  float local_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  ulong local_768;
  ulong uStack_760;
  undefined1 local_758 [16];
  uint local_748;
  uint uStack_744;
  uint uStack_740;
  uint uStack_73c;
  ulong local_738;
  ulong uStack_730;
  ulong local_728;
  ulong uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  ulong local_658;
  ulong uStack_650;
  ulong local_648;
  ulong uStack_640;
  ulong local_638;
  ulong uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  int local_618;
  int iStack_614;
  int iStack_610;
  int iStack_60c;
  ulong local_608;
  ulong uStack_600;
  ulong local_5f8;
  ulong uStack_5f0;
  ulong local_5e8;
  ulong uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  ulong local_5a8;
  ulong uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined4 local_588;
  undefined4 local_584;
  undefined4 local_580;
  undefined4 local_57c;
  undefined4 local_578;
  undefined4 local_574;
  undefined4 local_570;
  undefined4 local_56c;
  undefined4 local_568;
  undefined4 local_564;
  undefined4 local_560;
  undefined4 local_55c;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  ulong local_538;
  ulong uStack_530;
  ulong local_528;
  ulong uStack_520;
  ulong local_518;
  ulong uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  uint local_4d8;
  uint uStack_4d4;
  uint uStack_4d0;
  uint uStack_4cc;
  ulong local_4c8;
  ulong uStack_4c0;
  ulong local_4b8;
  ulong uStack_4b0;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  ulong local_498;
  ulong uStack_490;
  ulong local_488;
  ulong uStack_480;
  ulong local_478;
  ulong uStack_470;
  ulong local_468;
  ulong uStack_460;
  undefined4 local_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 local_43c;
  undefined4 local_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 local_41c;
  undefined4 local_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 local_3fc;
  undefined4 local_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 local_3dc;
  undefined4 local_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 local_3bc;
  undefined4 local_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 local_39c;
  undefined4 local_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 local_37c;
  undefined4 local_378;
  undefined4 uStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined4 local_35c;
  undefined4 local_358;
  undefined4 uStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined4 local_33c;
  undefined4 local_338;
  undefined4 uStack_334;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  undefined4 local_31c;
  undefined4 local_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  undefined4 local_2fc;
  undefined4 local_2f8;
  undefined4 uStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  undefined4 local_2dc;
  ulong local_2d8;
  ulong uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  ulong local_298;
  ulong uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined1 local_258 [16];
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  float *local_200;
  float *local_1f8;
  float *local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined8 *local_1a0;
  float *local_198;
  float *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  undefined8 *local_140;
  undefined8 *local_138;
  float *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined8 *local_e0;
  float *local_d8;
  float *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined8 *local_80;
  undefined8 *local_78;
  float *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_908 = *(int *)((long)in_RDI + 0x2c);
  local_90c = (int)in_RDI[6];
  local_910 = *(int *)((long)in_RDI + 0x34);
  local_914 = (int)in_RDI[7];
  local_918 = (int)in_RDI[3];
  local_91c = local_908 * local_90c * local_910 * local_918;
  local_8f8 = in_RDI;
  for (local_920 = 0; local_920 < local_914; local_920 = local_920 + 1) {
    local_8e0 = &local_970;
    local_874 = *(int *)((long)local_8f8 + 0x2c);
    local_878 = (int)local_8f8[6];
    local_87c = *(undefined4 *)((long)local_8f8 + 0x34);
    local_888 = (float *)(*local_8f8 + local_8f8[8] * (long)local_920 * local_8f8[2]);
    local_890 = local_8f8[2];
    local_894 = (undefined4)local_8f8[3];
    local_8a0 = local_8f8[4];
    local_870 = &local_970;
    local_860 = (long)local_874 * (long)local_878 * local_890;
    local_8d8 = &local_970;
    local_8c8 = &local_970;
    local_864 = 0x10;
    local_8ec = local_920;
    local_8ed = 1;
    local_970 = 0;
    local_960 = 0;
    local_958 = 0;
    local_948 = 0;
    local_944 = 0;
    local_940 = 0;
    local_93c = 0;
    local_938 = 0;
    local_930 = 0;
    local_968 = 0;
    local_928 = local_888;
    for (local_974 = 0; local_850 = local_8c8, local_950 = local_8a0, local_974 + 3 < local_91c;
        local_974 = local_974 + 4) {
      local_8c0 = local_928;
      local_658 = *(ulong *)local_928;
      uStack_650 = *(ulong *)(local_928 + 2);
      local_820 = local_901;
      local_828 = &local_988;
      local_55c = 0x80000000;
      local_43c = 0x80000000;
      local_458 = 0x80000000;
      local_668 = 0x8000000080000000;
      uStack_660 = 0x8000000080000000;
      local_560 = 0;
      local_41c = 0;
      local_438 = 0;
      local_678 = 0;
      uStack_670 = 0;
      local_564 = 0x3f000000;
      local_3fc = 0x3f000000;
      local_418 = 0x3f000000;
      local_688 = 0x3f0000003f000000;
      uStack_680 = 0x3f0000003f000000;
      local_568 = 0x3f800000;
      local_3dc = 0x3f800000;
      local_3f8 = 0x3f800000;
      local_698 = 0x3f8000003f800000;
      uStack_690 = 0x3f8000003f800000;
      local_56c = 0x3cc48f19;
      local_3bc = 0x3cc48f19;
      local_3d8 = 0x3cc48f19;
      local_6a8 = 0x3cc48f193cc48f19;
      uStack_6a0 = 0x3cc48f193cc48f19;
      local_570 = 0x3d2dbdcf;
      local_39c = 0x3d2dbdcf;
      local_3b8 = 0x3d2dbdcf;
      local_6b8 = 0x3d2dbdcf3d2dbdcf;
      uStack_6b0 = 0x3d2dbdcf3d2dbdcf;
      local_574 = 0x3d997dcc;
      local_37c = 0x3d997dcc;
      local_398 = 0x3d997dcc;
      local_6c8 = 0x3d997dcc3d997dcc;
      uStack_6c0 = 0x3d997dcc3d997dcc;
      local_578 = 0x3d3a73d8;
      local_35c = 0x3d3a73d8;
      local_378 = 0x3d3a73d8;
      local_6d8 = 0x3d3a73d83d3a73d8;
      uStack_6d0 = 0x3d3a73d83d3a73d8;
      local_57c = 0x3f800000;
      local_33c = 0x3f800000;
      local_358 = 0x3f800000;
      local_6e8 = 0x3f8000003f800000;
      uStack_6e0 = 0x3f8000003f800000;
      local_580 = 0x3e2aaaf8;
      local_31c = 0x3e2aaaf8;
      local_338 = 0x3e2aaaf8;
      local_6f8 = 0x3e2aaaf83e2aaaf8;
      uStack_6f0 = 0x3e2aaaf83e2aaaf8;
      local_584 = 0x3fc90fdb;
      local_2fc = 0x3fc90fdb;
      local_318 = 0x3fc90fdb;
      local_708 = 0x3fc90fdb3fc90fdb;
      uStack_700 = 0x3fc90fdb3fc90fdb;
      local_588 = 0x40490fdb;
      local_2dc = 0x40490fdb;
      local_2f8 = 0x40490fdb;
      local_718 = 0x40490fdb40490fdb;
      uStack_710 = 0x40490fdb40490fdb;
      local_728 = local_658 & 0x8000000080000000;
      uStack_720 = uStack_650 & 0x8000000080000000;
      local_738 = local_658 & 0x7fffffff7fffffff;
      uStack_730 = uStack_650 & 0x7fffffff7fffffff;
      local_18._0_4_ = (float)local_738;
      local_18._4_4_ = (float)(local_738 >> 0x20);
      uStack_10._0_4_ = (float)uStack_730;
      uStack_10._4_4_ = (float)(uStack_730 >> 0x20);
      local_748 = -(uint)((float)local_18 <= 0.5);
      uStack_744 = -(uint)(local_18._4_4_ <= 0.5);
      uStack_740 = -(uint)((float)uStack_10 <= 0.5);
      uStack_73c = -(uint)(uStack_10._4_4_ <= 0.5);
      local_278 = 1.0 - (float)local_18;
      fStack_274 = 1.0 - local_18._4_4_;
      fStack_270 = 1.0 - (float)uStack_10;
      fStack_26c = 1.0 - uStack_10._4_4_;
      local_258._0_4_ = local_278 * 0.5;
      local_258._4_4_ = fStack_274 * 0.5;
      local_258._8_4_ = fStack_270 * 0.5;
      local_258._12_4_ = fStack_26c * 0.5;
      local_758 = sqrtps(local_258,local_258);
      local_5f8 = CONCAT44(uStack_744,local_748);
      uStack_5f0 = CONCAT44(uStack_73c,uStack_740);
      local_468 = local_5f8 & local_738;
      uStack_460 = uStack_5f0 & uStack_730;
      local_528 = CONCAT44(uStack_744,local_748);
      uStack_520 = CONCAT44(uStack_73c,uStack_740);
      local_538 = local_758._0_8_;
      uStack_530 = local_758._8_8_;
      local_478 = ~local_528 & local_758._0_8_;
      uStack_470 = ~uStack_520 & local_758._8_8_;
      local_768 = local_468 | local_478;
      uStack_760 = uStack_460 | uStack_470;
      local_288._0_4_ = (float)local_768;
      local_288._4_4_ = (float)(local_768 >> 0x20);
      uStack_280._0_4_ = (float)uStack_760;
      uStack_280._4_4_ = (float)(uStack_760 >> 0x20);
      local_778 = (float)local_288 * (float)local_288;
      fStack_774 = local_288._4_4_ * local_288._4_4_;
      fStack_770 = (float)uStack_280 * (float)uStack_280;
      fStack_76c = uStack_280._4_4_ * uStack_280._4_4_;
      local_2b8 = CONCAT44(fStack_774,local_778);
      uStack_2b0 = CONCAT44(fStack_76c,fStack_770);
      local_788 = local_778 * local_778;
      fStack_784 = fStack_774 * fStack_774;
      fStack_780 = fStack_770 * fStack_770;
      fStack_77c = fStack_76c * fStack_76c;
      local_190 = &local_788;
      local_78 = &local_6b8;
      local_80 = &local_6d8;
      local_58 = CONCAT44(fStack_784,local_788);
      uStack_50 = CONCAT44(fStack_77c,fStack_780);
      local_68 = 0x3d2dbdcf3d2dbdcf;
      uStack_60 = 0x3d2dbdcf3d2dbdcf;
      local_38 = local_788 * 0.042417344;
      fStack_34 = fStack_784 * 0.042417344;
      fStack_30 = fStack_780 * 0.042417344;
      fStack_2c = fStack_77c * 0.042417344;
      local_48 = 0x3d3a73d83d3a73d8;
      uStack_40 = 0x3d3a73d83d3a73d8;
      local_7b8 = local_38 + 0.045520633;
      fStack_7b4 = fStack_34 + 0.045520633;
      fStack_7b0 = fStack_30 + 0.045520633;
      fStack_7ac = fStack_2c + 0.045520633;
      local_d8 = &local_7b8;
      local_e0 = &local_6f8;
      local_b8 = CONCAT44(fStack_784,local_788);
      uStack_b0 = CONCAT44(fStack_77c,fStack_780);
      local_c8 = CONCAT44(fStack_7b4,local_7b8);
      uStack_c0 = CONCAT44(fStack_7ac,fStack_7b0);
      local_98 = local_788 * local_7b8;
      fStack_94 = fStack_784 * fStack_7b4;
      fStack_90 = fStack_780 * fStack_7b0;
      fStack_8c = fStack_77c * fStack_7ac;
      local_a8 = 0x3e2aaaf83e2aaaf8;
      uStack_a0 = 0x3e2aaaf83e2aaaf8;
      local_7a8 = local_98 + 0.16666782;
      fStack_7a4 = fStack_94 + 0.16666782;
      fStack_7a0 = fStack_90 + 0.16666782;
      fStack_79c = fStack_8c + 0.16666782;
      local_138 = &local_6a8;
      local_140 = &local_6c8;
      local_118 = CONCAT44(fStack_784,local_788);
      uStack_110 = CONCAT44(fStack_77c,fStack_780);
      local_128 = 0x3cc48f193cc48f19;
      uStack_120 = 0x3cc48f193cc48f19;
      local_f8 = local_788 * 0.023994016;
      fStack_f4 = fStack_784 * 0.023994016;
      fStack_f0 = fStack_780 * 0.023994016;
      fStack_ec = fStack_77c * 0.023994016;
      local_108 = 0x3d997dcc3d997dcc;
      uStack_100 = 0x3d997dcc3d997dcc;
      local_7d8 = local_f8 + 0.07494697;
      fStack_7d4 = fStack_f4 + 0.07494697;
      fStack_7d0 = fStack_f0 + 0.07494697;
      fStack_7cc = fStack_ec + 0.07494697;
      local_198 = &local_7d8;
      local_1a0 = &local_6e8;
      local_178 = CONCAT44(fStack_784,local_788);
      uStack_170 = CONCAT44(fStack_77c,fStack_780);
      local_188 = CONCAT44(fStack_7d4,local_7d8);
      uStack_180 = CONCAT44(fStack_7cc,fStack_7d0);
      local_158 = local_788 * local_7d8;
      fStack_154 = fStack_784 * fStack_7d4;
      fStack_150 = fStack_780 * fStack_7d0;
      fStack_14c = fStack_77c * fStack_7cc;
      local_168 = 0x3f8000003f800000;
      uStack_160 = 0x3f8000003f800000;
      local_7c8 = local_158 + 1.0;
      fStack_7c4 = fStack_154 + 1.0;
      fStack_7c0 = fStack_150 + 1.0;
      fStack_7bc = fStack_14c + 1.0;
      local_1f0 = &local_778;
      local_1f8 = &local_7a8;
      local_200 = &local_7c8;
      local_1d8 = CONCAT44(fStack_774,local_778);
      uStack_1d0 = CONCAT44(fStack_76c,fStack_770);
      local_1e8 = CONCAT44(fStack_7a4,local_7a8);
      uStack_1e0 = CONCAT44(fStack_79c,fStack_7a0);
      local_1b8 = local_778 * local_7a8;
      fStack_1b4 = fStack_774 * fStack_7a4;
      fStack_1b0 = fStack_770 * fStack_7a0;
      fStack_1ac = fStack_76c * fStack_79c;
      local_1c8 = CONCAT44(fStack_7c4,local_7c8);
      uStack_1c0 = CONCAT44(fStack_7bc,fStack_7c0);
      local_798 = local_1b8 + local_7c8;
      fStack_794 = fStack_1b4 + fStack_7c4;
      fStack_790 = fStack_1b0 + fStack_7c0;
      fStack_78c = fStack_1ac + fStack_7bc;
      local_2c8 = CONCAT44(fStack_794,local_798);
      uStack_2c0 = CONCAT44(fStack_78c,fStack_790);
      local_7e8 = local_798 * (float)local_288;
      fStack_7e4 = fStack_794 * local_288._4_4_;
      fStack_7e0 = fStack_790 * (float)uStack_280;
      fStack_7dc = fStack_78c * uStack_280._4_4_;
      local_488 = CONCAT44(fStack_7e4,local_7e8);
      uStack_480 = CONCAT44(fStack_7dc,fStack_7e0);
      uVar2 = local_488 | local_728;
      uVar4 = uStack_480 | uStack_720;
      local_5c8._0_4_ = (float)uVar2;
      local_5c8._4_4_ = (float)(uVar2 >> 0x20);
      uStack_5c0._0_4_ = (float)uVar4;
      uStack_5c0._4_4_ = (float)(uVar4 >> 0x20);
      local_7f8 = 1.5707964 - (float)local_5c8;
      fStack_7f4 = 1.5707964 - local_5c8._4_4_;
      fStack_7f0 = 1.5707964 - (float)uStack_5c0;
      fStack_7ec = 1.5707964 - uStack_5c0._4_4_;
      local_4e8._0_4_ = (float)local_658;
      local_4e8._4_4_ = (float)(local_658 >> 0x20);
      uStack_4e0._0_4_ = (float)uStack_650;
      uStack_4e0._4_4_ = (float)(uStack_650 >> 0x20);
      local_618 = -(uint)((float)local_4e8 < 0.0);
      iStack_614 = -(uint)(local_4e8._4_4_ < 0.0);
      iStack_610 = -(uint)((float)uStack_4e0 < 0.0);
      iStack_60c = -(uint)(uStack_4e0._4_4_ < 0.0);
      uVar6 = CONCAT44(iStack_614,local_618) & 0x40490fdb40490fdb;
      uVar7 = CONCAT44(iStack_60c,iStack_610) & 0x40490fdb40490fdb;
      local_228 = CONCAT44(fStack_7e4,local_7e8);
      uStack_220 = CONCAT44(fStack_7dc,fStack_7e0);
      local_4a8 = local_7e8 + local_7e8;
      fStack_4a4 = fStack_7e4 + fStack_7e4;
      fStack_4a0 = fStack_7e0 + fStack_7e0;
      fStack_49c = fStack_7dc + fStack_7dc;
      uVar3 = CONCAT44(fStack_4a4,local_4a8) | local_728;
      uVar5 = CONCAT44(fStack_49c,fStack_4a0) | uStack_720;
      local_238._0_4_ = (float)uVar6;
      local_238._4_4_ = (float)(uVar6 >> 0x20);
      uStack_230._0_4_ = (float)uVar7;
      uStack_230._4_4_ = (float)(uVar7 >> 0x20);
      local_248._0_4_ = (float)uVar3;
      local_248._4_4_ = (float)(uVar3 >> 0x20);
      uStack_240._0_4_ = (float)uVar5;
      uStack_240._4_4_ = (float)(uVar5 >> 0x20);
      local_808 = (float)local_238 + (float)local_248;
      fStack_804 = local_238._4_4_ + local_248._4_4_;
      fStack_800 = (float)uStack_230 + (float)uStack_240;
      fStack_7fc = uStack_230._4_4_ + uStack_240._4_4_;
      local_638 = CONCAT44(uStack_744,local_748);
      uStack_630 = CONCAT44(uStack_73c,uStack_740);
      local_648 = CONCAT44(fStack_7f4,local_7f8);
      uStack_640 = CONCAT44(fStack_7ec,fStack_7f0);
      local_4c8 = local_638 & local_648;
      uStack_4c0 = uStack_630 & uStack_640;
      local_548 = CONCAT44(uStack_744,local_748);
      uStack_540 = CONCAT44(uStack_73c,uStack_740);
      local_558 = CONCAT44(fStack_804,local_808);
      uStack_550 = CONCAT44(fStack_7fc,fStack_800);
      local_4d8 = (local_748 ^ 0xffffffff) & (uint)local_808;
      uStack_4d4 = (uStack_744 ^ 0xffffffff) & (uint)fStack_804;
      uStack_4d0 = (uStack_740 ^ 0xffffffff) & (uint)fStack_800;
      uStack_4cc = (uStack_73c ^ 0xffffffff) & (uint)fStack_7fc;
      local_988 = local_4c8 | CONCAT44(uStack_4d4,local_4d8);
      uStack_980 = uStack_4c0 | CONCAT44(uStack_4cc,uStack_4d0);
      local_8a8 = local_928;
      local_8b8._0_4_ = (float)local_988;
      local_8b8._4_4_ = (float)(local_988 >> 0x20);
      uStack_8b0._0_4_ = (float)uStack_980;
      uStack_8b0._4_4_ = (float)(uStack_980 >> 0x20);
      *local_928 = (float)local_8b8;
      local_928[1] = local_8b8._4_4_;
      local_928[2] = (float)uStack_8b0;
      local_928[3] = uStack_8b0._4_4_;
      local_928 = local_928 + 4;
      local_8b8 = local_988;
      uStack_8b0 = uStack_980;
      local_628 = local_718;
      uStack_620 = uStack_710;
      local_608 = local_738;
      uStack_600 = uStack_730;
      local_5e8 = local_658;
      uStack_5e0 = uStack_650;
      local_5d8 = local_668;
      uStack_5d0 = uStack_660;
      local_5c8 = uVar2;
      uStack_5c0 = uVar4;
      local_5b8 = local_708;
      uStack_5b0 = uStack_700;
      local_5a8 = local_738;
      uStack_5a0 = uStack_730;
      local_598 = local_698;
      uStack_590 = uStack_690;
      local_518 = local_658;
      uStack_510 = uStack_650;
      local_508 = local_668;
      uStack_500 = uStack_660;
      local_4f8 = local_678;
      uStack_4f0 = uStack_670;
      local_4e8 = local_658;
      uStack_4e0 = uStack_650;
      local_4b8 = local_728;
      uStack_4b0 = uStack_720;
      local_498 = local_728;
      uStack_490 = uStack_720;
      uStack_454 = local_458;
      uStack_450 = local_458;
      uStack_44c = local_458;
      uStack_434 = local_438;
      uStack_430 = local_438;
      uStack_42c = local_438;
      uStack_414 = local_418;
      uStack_410 = local_418;
      uStack_40c = local_418;
      uStack_3f4 = local_3f8;
      uStack_3f0 = local_3f8;
      uStack_3ec = local_3f8;
      uStack_3d4 = local_3d8;
      uStack_3d0 = local_3d8;
      uStack_3cc = local_3d8;
      uStack_3b4 = local_3b8;
      uStack_3b0 = local_3b8;
      uStack_3ac = local_3b8;
      uStack_394 = local_398;
      uStack_390 = local_398;
      uStack_38c = local_398;
      uStack_374 = local_378;
      uStack_370 = local_378;
      uStack_36c = local_378;
      uStack_354 = local_358;
      uStack_350 = local_358;
      uStack_34c = local_358;
      uStack_334 = local_338;
      uStack_330 = local_338;
      uStack_32c = local_338;
      uStack_314 = local_318;
      uStack_310 = local_318;
      uStack_30c = local_318;
      uStack_2f4 = local_2f8;
      uStack_2f0 = local_2f8;
      uStack_2ec = local_2f8;
      local_2d8 = local_768;
      uStack_2d0 = uStack_760;
      local_2a8 = local_2b8;
      uStack_2a0 = uStack_2b0;
      local_298 = local_768;
      uStack_290 = uStack_760;
      local_288 = local_768;
      uStack_280 = uStack_760;
      local_268 = local_688;
      uStack_260 = uStack_680;
      local_248 = uVar3;
      uStack_240 = uVar5;
      local_238 = uVar6;
      uStack_230 = uVar7;
      local_218 = local_228;
      uStack_210 = uStack_220;
      local_130 = local_190;
      local_d0 = local_190;
      local_70 = local_190;
      local_28 = local_688;
      uStack_20 = uStack_680;
      local_18 = local_738;
      uStack_10 = uStack_730;
    }
    for (; local_974 < local_91c; local_974 = local_974 + 1) {
      local_810 = local_901;
      local_818 = local_928;
      fVar1 = acosf(*local_928);
      *local_928 = fVar1;
      local_928 = local_928 + 1;
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}